

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  undefined7 uVar2;
  pool_ptr<soul::heart::ProcessorInstance> local_50;
  undefined1 local_48 [40];
  Connection *local_20;
  Connection *c;
  Connection *old_local;
  ModuleCloner *this_local;
  
  c = (Connection *)__fn;
  old_local = (Connection *)this;
  local_20 = Module::allocate<soul::heart::Connection,soul::CodeLocation_const&>
                       (this->newModule,(CodeLocation *)(__fn + 8));
  local_20->interpolationType = c->interpolationType;
  local_48._24_8_ = (c->source).processor.object;
  getRemappedProcessorInstance
            ((ModuleCloner *)(local_48 + 0x20),(pool_ptr<soul::heart::ProcessorInstance> *)this);
  (local_20->source).processor.object = (ProcessorInstance *)local_48._32_8_;
  pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr
            ((pool_ptr<soul::heart::ProcessorInstance> *)(local_48 + 0x20));
  pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr
            ((pool_ptr<soul::heart::ProcessorInstance> *)(local_48 + 0x18));
  std::__cxx11::string::operator=
            ((string *)&(local_20->source).endpointName,(string *)&(c->source).endpointName);
  uVar1 = *(undefined8 *)
           &(c->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged;
  (local_20->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (c->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  *(undefined8 *)
   ((long)&(local_20->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>.
           _M_payload.super__Optional_payload_base<unsigned_long> + 8) = uVar1;
  local_50.object = (c->dest).processor.object;
  getRemappedProcessorInstance
            ((ModuleCloner *)local_48,(pool_ptr<soul::heart::ProcessorInstance> *)this);
  (local_20->dest).processor.object = (ProcessorInstance *)local_48._0_8_;
  pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr
            ((pool_ptr<soul::heart::ProcessorInstance> *)local_48);
  pool_ptr<soul::heart::ProcessorInstance>::~pool_ptr(&local_50);
  std::__cxx11::string::operator=
            ((string *)&(local_20->dest).endpointName,(string *)&(c->dest).endpointName);
  (local_20->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       (c->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  *(undefined8 *)
   ((long)&(local_20->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload
           .super__Optional_payload_base<unsigned_long> + 8) =
       *(undefined8 *)
        &(c->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
  (local_20->delayLength).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload =
       (c->delayLength).super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload;
  uVar2 = *(undefined7 *)
           &(c->delayLength).super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>.field_0x9;
  (local_20->delayLength).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged =
       (c->delayLength).super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_engaged;
  *(undefined7 *)
   &(local_20->delayLength).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>.field_0x9 = uVar2;
  return (int)local_20;
}

Assistant:

heart::Connection& clone (const heart::Connection& old)
    {
        auto& c = newModule.allocate<heart::Connection> (old.location);
        c.interpolationType     = old.interpolationType;
        c.source.processor      = getRemappedProcessorInstance (old.source.processor);
        c.source.endpointName   = old.source.endpointName;
        c.source.endpointIndex  = old.source.endpointIndex;
        c.dest.processor        = getRemappedProcessorInstance (old.dest.processor);
        c.dest.endpointName     = old.dest.endpointName;
        c.dest.endpointIndex    = old.dest.endpointIndex;
        c.delayLength           = old.delayLength;
        return c;
    }